

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token __thiscall slang::parsing::Lexer::lexDirective(Lexer *this)

{
  char cVar1;
  uint32_t uVar2;
  Lexer *in_RDI;
  Token TVar3;
  bool in_stack_0000000f;
  undefined1 in_stack_00000010 [16];
  SyntaxKind directive;
  TokenKind in_stack_0000003e;
  Lexer *in_stack_00000040;
  Lexer *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffd0 [16];
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined1 local_10 [16];
  
  cVar1 = peek(in_RDI);
  if (cVar1 == '\\') {
    advance(in_RDI);
    local_10 = (undefined1  [16])
               lexEscapeSequence(in_stack_ffffffffffffffc0,SUB81((ulong)in_RDI >> 0x38,0));
  }
  else {
    scanIdentifier(in_stack_ffffffffffffffc0);
    uVar2 = lexemeLength(in_RDI);
    if (uVar2 == 1) {
      local_10 = (undefined1  [16])create<>(this,directive._2_2_);
    }
    else {
      lexeme(in_stack_ffffffffffffffc0);
      std::basic_string_view<char,_std::char_traits<char>_>::substr
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffd0._8_8_,in_stack_ffffffffffffffd0._0_8_);
      LexerFacts::getDirectiveKind((string_view)in_stack_00000010,in_stack_0000000f);
      local_10 = (undefined1  [16])
                 create<slang::syntax::SyntaxKind&>
                           (in_stack_00000040,in_stack_0000003e,(SyntaxKind *)this);
    }
  }
  TVar3.kind = local_10._0_2_;
  TVar3._2_1_ = local_10[2];
  TVar3.numFlags.raw = local_10[3];
  TVar3.rawLen = local_10._4_4_;
  TVar3.info = (Info *)local_10._8_8_;
  return TVar3;
}

Assistant:

Token Lexer::lexDirective() {
    if (peek() == '\\') {
        // Handle escaped macro names as well.
        advance();
        return lexEscapeSequence(true);
    }

    scanIdentifier();

    // if length is 1, we just have a grave character on its own, which is an error
    if (lexemeLength() == 1) {
        // Error issued in the Preprocessor
        return create(TokenKind::Unknown);
    }

    SyntaxKind directive = LF::getDirectiveKind(lexeme().substr(1), options.enableLegacyProtect);
    return create(TokenKind::Directive, directive);
}